

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# websocket.c
# Opt level: O0

void ws_http_cb_listener(nni_ws *ws,nni_aio *aio)

{
  nni_ws_listener *pnVar1;
  nng_err nVar2;
  int iVar3;
  nni_aio *aio_00;
  nni_ws_listener *l;
  nni_aio *aio_local;
  nni_ws *ws_local;
  
  pnVar1 = ws->listener;
  nni_mtx_lock(&pnVar1->mtx);
  nni_list_remove(&pnVar1->reply,ws);
  nVar2 = nni_aio_result(aio);
  if (nVar2 == NNG_OK) {
    ws->ready = true;
    aio_00 = (nni_aio *)nni_list_first(&pnVar1->aios);
    if (aio_00 == (nni_aio *)0x0) {
      nni_list_append(&pnVar1->pend,ws);
    }
    else {
      nni_list_remove(&pnVar1->aios,aio_00);
      nni_aio_set_output(aio_00,0,ws);
      nni_aio_finish(aio_00,NNG_OK,0);
    }
    iVar3 = nni_list_empty(&pnVar1->reply);
    if (iVar3 != 0) {
      nni_cv_wake(&pnVar1->cv);
    }
    nni_mtx_unlock(&pnVar1->mtx);
  }
  else {
    nni_mtx_unlock(&pnVar1->mtx);
    ws_reap(ws);
  }
  return;
}

Assistant:

static void
ws_http_cb_listener(nni_ws *ws, nni_aio *aio)
{
	nni_ws_listener *l = ws->listener;

	nni_mtx_lock(&l->mtx);
	nni_list_remove(&l->reply, ws);
	if (nni_aio_result(aio) != 0) {
		nni_mtx_unlock(&l->mtx);
		ws_reap(ws);
		return;
	}
	ws->ready = true;
	if ((aio = nni_list_first(&l->aios)) != NULL) {
		nni_list_remove(&l->aios, aio);
		nni_aio_set_output(aio, 0, ws);
		nni_aio_finish(aio, 0, 0);
	} else {
		nni_list_append(&l->pend, ws);
	}
	if (nni_list_empty(&l->reply)) {
		nni_cv_wake(&l->cv);
	}
	nni_mtx_unlock(&l->mtx);
}